

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall
p2t::Sweep::FillLeftConvexEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Orientation OVar1;
  Node *node_local;
  Edge *edge_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  OVar1 = Orient2d(node->prev->point,node->prev->prev->point,node->prev->prev->prev->point);
  if (OVar1 == CW) {
    FillLeftConcaveEdgeEvent(this,tcx,edge,node->prev);
  }
  else {
    OVar1 = Orient2d(edge->q,node->prev->prev->point,edge->p);
    if (OVar1 == CW) {
      FillLeftConvexEdgeEvent(this,tcx,edge,node->prev);
    }
  }
  return;
}

Assistant:

void Sweep::FillLeftConvexEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  // Next concave or convex?
  if (Orient2d(*node.prev->point, *node.prev->prev->point, *node.prev->prev->prev->point) == CW) {
    // Concave
    FillLeftConcaveEdgeEvent(tcx, edge, *node.prev);
  } else{
    // Convex
    // Next above or below edge?
    if (Orient2d(*edge->q, *node.prev->prev->point, *edge->p) == CW) {
      // Below
      FillLeftConvexEdgeEvent(tcx, edge, *node.prev);
    } else{
      // Above
    }
  }
}